

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

void openjtalk_test(OpenJTalk *oj,void *text)

{
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
    return;
  }
  openjtalk_test_cold_1();
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_test(OpenJTalk *oj, void *text)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	g_psd->data = NULL;

	bool temp = g_verbose;
	g_verbose = true;
	fprintf(stderr, u8"***** test start *****\n");

	if (text != NULL)
	{
		fprintf(stderr, u8"* hex dump\n");
		char *temp_char = (char *)text;
		for (int i = 0; i <= 127; i++)
		{
			fprintf(stderr, u8"%02x ", temp_char[i] & 0xff);
			if (i % 16 == 15)
			{
				fprintf(stderr, u8"\n");
			}
		}
		fprintf(stderr, u8"\n");

		fprintf(stderr, u8"* encoding in UTF-16le\n");
		char16_t *temp_char16 = (char16_t *)text;
		openjtalk_speakSyncU16(oj, temp_char16);

		fprintf(stderr, u8"* encoding in UTF-8\n");
		char *temp_char_utf8 = (char *)text;
		openjtalk_speakSync(oj, temp_char_utf8);

		fprintf(stderr, u8"* encoding in SHIFT_JIS\n");
		char *temp_charSjis = (char *)text;
		openjtalk_speakSyncSjis(oj, temp_charSjis);
	}
	else
	{
		openjtalk_speakSync(oj, u8"聞こえますか？");
	}
	fprintf(stderr, u8"***** finished *****\n\n");
	g_verbose = temp;
}